

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

shared_ptr<libtorrent::torrent_info> __thiscall
libtorrent::aux::torrent::get_torrent_copy_with_hashes(torrent *this)

{
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Var1;
  pointer pdVar2;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  digest32<256L> *h;
  pointer this_00;
  long in_RSI;
  merkle_tree *this_01;
  shared_ptr<libtorrent::torrent_info> sVar4;
  shared_ptr<libtorrent::torrent_info> ret;
  vector<char,_std::allocator<char>_> out_layer;
  vector<aux::vector<char>,_file_index_t> v2_hashes;
  request_callback local_b8;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_b0;
  vector<char,_std::allocator<char>_> local_a8;
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_88;
  vector<sha256_hash> local_68;
  merkle_tree *local_50;
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_48;
  
  if (((*(torrent_info **)(in_RSI + 0x18))->m_files).m_piece_length < 1) {
    (this->super_request_callback)._vptr_request_callback = (_func_int **)0x0;
    (this->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
         (piece_picker *)0x0;
    goto LAB_0032e558;
  }
  local_b8._vptr_request_callback = (_func_int **)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libtorrent::torrent_info,std::allocator<libtorrent::torrent_info>,libtorrent::torrent_info&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0,(torrent_info **)&local_b8,
             (allocator<libtorrent::torrent_info> *)&local_88,*(torrent_info **)(in_RSI + 0x18));
  bVar3 = torrent_info::v2((torrent_info *)local_b8._vptr_request_callback);
  in_RDX._M_pi = extraout_RDX;
  if (bVar3) {
    local_88.
    super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01 = *(merkle_tree **)(in_RSI + 0x3f8);
    local_50 = *(merkle_tree **)(in_RSI + 0x400);
    bVar3 = this_01 == local_50;
    if (!bVar3) {
      do {
        merkle_tree::get_piece_layer(&local_68,this_01);
        local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        ::std::vector<char,_std::allocator<char>_>::reserve
                  (&local_a8,
                   (long)local_68.
                         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         .
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_68.
                         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         .
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        pdVar2 = local_68.
                 super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = local_68.
                       super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       .
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != pdVar2;
            this_00 = this_00 + 1) {
          bVar3 = digest32<256L>::is_all_zeros(this_00);
          if (bVar3) {
            (this->super_request_callback)._vptr_request_callback = (_func_int **)0x0;
            (this->super_torrent_hot_members).m_picker._M_t.
            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
                 (piece_picker *)0x0;
            if (local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage -
                              (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                    .super__Vector_impl_data._M_start);
            }
            if (local_68.
                super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                .
                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (digest32<256L> *)0x0) {
              operator_delete(local_68.
                              super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                              .
                              super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_68.
                                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    .
                                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_68.
                                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    .
                                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_0032e53f;
          }
          ::std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                    ((vector<char,std::allocator<char>> *)&local_a8,
                     local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,this_00,this_00 + 1);
        }
        ::std::
        vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>
        ::emplace_back<std::vector<char,std::allocator<char>>>
                  ((vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>
                    *)&local_88,&local_a8);
        if (local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_68.
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (digest32<256L> *)0x0) {
          operator_delete(local_68.
                          super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          .
                          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                .
                                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                .
                                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (this_00 != pdVar2) {
LAB_0032e53f:
          ::std::
          vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
          ::~vector(&local_88);
          in_RDX._M_pi = extraout_RDX_01;
          goto LAB_0032e549;
        }
        this_01 = this_01 + 1;
        bVar3 = this_01 == local_50;
      } while (!bVar3);
    }
    local_48.
    super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_88.
         super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.
    super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    torrent_info::set_piece_layers
              ((torrent_info *)local_b8._vptr_request_callback,
               (vector<aux::vector<char>,_file_index_t> *)&local_48);
    ::std::
    vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ::~vector(&local_48);
    ::std::
    vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
    ::~vector(&local_88);
    in_RDX._M_pi = extraout_RDX_00;
    if (bVar3) goto LAB_0032e4e8;
  }
  else {
LAB_0032e4e8:
    _Var1._M_head_impl = local_b0._M_head_impl;
    (this->super_request_callback)._vptr_request_callback = local_b8._vptr_request_callback;
    (this->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
         (piece_picker *)0x0;
    local_b0._M_head_impl = (piece_picker *)0x0;
    (this->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl = _Var1._M_head_impl
    ;
    local_b8._vptr_request_callback = (_func_int **)0x0;
  }
LAB_0032e549:
  if (local_b0._M_head_impl != (piece_picker *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_head_impl);
    in_RDX._M_pi = extraout_RDX_02;
  }
LAB_0032e558:
  sVar4.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar4.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::torrent_info>)
         sVar4.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_info> torrent::get_torrent_copy_with_hashes() const
	{
		if (!m_torrent_file->is_valid()) return {};
		auto ret = std::make_shared<torrent_info>(*m_torrent_file);

		if (ret->v2())
		{
			aux::vector<aux::vector<char>, file_index_t> v2_hashes;
			for (auto const& tree : m_merkle_trees)
			{
				auto const& layer = tree.get_piece_layer();
				std::vector<char> out_layer;
				out_layer.reserve(layer.size() * sha256_hash::size());
				for (auto const& h : layer)
				{
					// we're missing a piece layer. We can't return a valid
					// torrent
					if (h.is_all_zeros()) return {};
					out_layer.insert(out_layer.end(), h.data(), h.data() + sha256_hash::size());
				}
				v2_hashes.emplace_back(std::move(out_layer));
			}
			ret->set_piece_layers(std::move(v2_hashes));
		}

		return ret;
	}